

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::SetObjectMarkedBit(LargeHeapBlock *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  LargeObjectHeader *local_28;
  LargeObjectHeader *pHeader;
  
  BVar3 = IsValidObject(this,objectAddress);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x33b,"(IsValidObject(objectAddress))","IsValidObject(objectAddress)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_28 = (LargeObjectHeader *)0x0;
  bVar2 = GetObjectHeader(this,objectAddress,&local_28);
  if (bVar2) {
    HeapBlockMap64::SetMark(&this->heapInfo->recycler->heapBlockMap,objectAddress);
    return;
  }
  return;
}

Assistant:

void
LargeHeapBlock::SetObjectMarkedBit(void* objectAddress)
{
    Assert(IsValidObject(objectAddress));

    LargeObjectHeader* pHeader = nullptr;

    if (GetObjectHeader(objectAddress, &pHeader))
    {
        Recycler* recycler = this->heapInfo->recycler;

        recycler->heapBlockMap.SetMark(objectAddress);
    }
}